

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

ThreadLog * __thiscall deqp::egl::ThreadLog::operator<<(ThreadLog *this,char **t)

{
  char **t_local;
  ThreadLog *this_local;
  
  std::operator<<((ostream *)this,*t);
  return this;
}

Assistant:

ThreadLog&					operator<<	(const T& t)				{ m_message << t; return *this; }